

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O1

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec2i *pts,TGAColor *colors)

{
  int iVar1;
  vec<2,_float,_(glm::qualifier)0> A;
  vec<2,_float,_(glm::qualifier)0> B;
  vec<2,_float,_(glm::qualifier)0> C;
  vec<2,_float,_(glm::qualifier)0> P;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int i;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar14;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar15;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar16;
  Vec3f VVar17;
  TGAColor c;
  TGAColor local_64;
  int local_5c;
  TinyRender *local_58;
  TGAColor *local_50;
  undefined1 local_48 [16];
  
  local_50 = colors;
  iVar4 = TGAImage::get_width(this->mImage);
  iVar4 = iVar4 + -1;
  iVar5 = TGAImage::get_height(this->mImage);
  iVar5 = iVar5 + -1;
  iVar6 = TGAImage::get_width(this->mImage);
  local_58 = this;
  iVar7 = TGAImage::get_height(this->mImage);
  iVar12 = 0;
  iVar9 = 0;
  lVar8 = 0;
  do {
    iVar10 = 1;
    do {
      bVar13 = iVar10 == 0;
      iVar11 = iVar4;
      if (bVar13) {
        iVar11 = iVar5;
      }
      iVar2 = iVar6;
      if (bVar13) {
        iVar2 = iVar7;
      }
      iVar1 = (&pts[lVar8].field_0)[bVar13].x;
      iVar3 = iVar12;
      if (bVar13) {
        iVar3 = iVar9;
      }
      if (iVar1 < iVar11) {
        iVar11 = iVar1;
      }
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      if (iVar3 < iVar1) {
        iVar3 = iVar1;
      }
      if (iVar2 + -1 <= iVar3) {
        iVar3 = iVar2 + -1;
      }
      bVar13 = iVar10 == 0;
      iVar10 = iVar10 + -1;
      if (bVar13) {
        iVar9 = iVar3;
        iVar5 = iVar11;
        iVar11 = iVar4;
        iVar3 = iVar12;
      }
      iVar12 = iVar3;
      iVar4 = iVar11;
    } while (iVar10 == 0);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  TGAImage::get_width(local_58->mImage);
  if (iVar4 <= iVar12) {
    local_5c = iVar9 + 1;
    do {
      if (iVar5 <= iVar9) {
        local_48 = ZEXT416((uint)(float)iVar4);
        iVar6 = iVar5;
        do {
          A.field_1.y = (float)(pts->field_1).y;
          A.field_0.x = (float)(pts->field_0).x;
          B.field_1.y = (float)pts[1].field_1.y;
          B.field_0.x = (float)pts[1].field_0.x;
          C.field_1.y = (float)pts[2].field_1.y;
          C.field_0.x = (float)pts[2].field_0.x;
          P.field_1.y = (float)iVar6;
          P.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)local_48._0_4_
          ;
          VVar17 = barycentric<2ul>(A,B,C,P);
          aVar16 = VVar17.field_2;
          aVar14 = VVar17.field_0;
          aVar15 = VVar17.field_1;
          if (((0.0 <= aVar14.x) && (0.0 <= aVar15.y)) && (0.0 <= aVar16.z)) {
            local_64.bytespp = '\x01';
            local_64.bgra[1] =
                 (uchar)(int)((float)local_50[2].bgra[1] * aVar16.z +
                             (float)local_50->bgra[1] * aVar14.x +
                             (float)local_50[1].bgra[1] * aVar15.y);
            local_64.bgra[0] =
                 (uchar)(int)((float)local_50[2].bgra[0] * aVar16.z +
                             (float)local_50->bgra[0] * aVar14.x +
                             (float)local_50[1].bgra[0] * aVar15.y);
            local_64.bgra[2] =
                 (char)(int)((float)local_50[2].bgra[2] * aVar16.z +
                            (float)local_50->bgra[2] * aVar14.x +
                            (float)local_50[1].bgra[2] * aVar15.y);
            local_64.bgra[3] = '\0';
            TGAImage::set(local_58->mImage,iVar4,iVar6,&local_64);
          }
          iVar6 = iVar6 + 1;
        } while (local_5c != iVar6);
      }
      bVar13 = iVar4 != iVar12;
      iVar4 = iVar4 + 1;
    } while (bVar13);
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec2i* pts, TGAColor* colors) {
  Vec2i bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  int width = mImage->get_width();

  Vec2i p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<2>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;
      TGAColor c;
      /*
              barycentric result can also interpolation Color
      */
      c.bgra[0] = bc_screen[0] * colors[0].bgra[0] +
                  bc_screen[1] * colors[1].bgra[0] +
                  bc_screen[2] * colors[2].bgra[0];
      c.bgra[1] = bc_screen[0] * colors[0].bgra[1] +
                  bc_screen[1] * colors[1].bgra[1] +
                  bc_screen[2] * colors[2].bgra[1];
      c.bgra[2] = bc_screen[0] * colors[0].bgra[2] +
                  bc_screen[1] * colors[1].bgra[2] +
                  bc_screen[2] * colors[2].bgra[2];
      mImage->set(p[0], p[1], c);
    }
  }
}